

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1536,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  pfHash p_Var3;
  reference pvVar4;
  size_type sVar5;
  uint in_EDX;
  char *pcVar6;
  uint in_ESI;
  bool result;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined4 in_stack_ffffffffffffff08;
  byte bVar7;
  undefined4 in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  pfHash in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffffdb;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_ffffffffffffffe0;
  hashfunc local_8 [8];
  
  uVar1 = in_EDX & 1;
  pcVar6 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar6 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar6,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x17380f);
  Blob<1536>::Blob((Blob<1536> *)&stack0xffffffffffffff18);
  memset(&stack0xffffffffffffff18,0,0xc0);
  if (uVar1 != 0) {
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    p_Var3 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar4 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[]
                       ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)&stack0xffffffffffffffd8,0
                       );
    (*p_Var3)(&stack0xffffffffffffff18,0xc0,0,pvVar4);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1536>,Blob<160>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (bool)in_stack_ffffffffffffff17,
             (Blob<1536> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(in_ESI,in_EDX));
  sVar5 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size
                    ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)&stack0xffffffffffffffd8);
  printf("%d keys\n",sVar5 & 0xffffffff);
  bVar7 = 1;
  bVar2 = TestHashList<Blob<160>>
                    (in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                     (bool)in_stack_ffffffffffffffde,(bool)in_stack_ffffffffffffffdd,
                     (bool)in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  bVar7 = bVar2 & bVar7;
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar7 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}